

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemNumerify(Mem *pMem)

{
  undefined2 uVar1;
  int iVar2;
  uint uVar3;
  double dVar4;
  
  uVar3 = (uint)pMem->flags;
  if ((pMem->flags & 0xd) == 0) {
    iVar2 = sqlite3Atoi64(pMem->z,&(pMem->u).i,pMem->n,pMem->enc);
    if (iVar2 == 0) {
      uVar3._0_2_ = pMem->flags;
      uVar3._2_1_ = pMem->type;
      uVar3._3_1_ = pMem->enc;
      uVar3 = uVar3 & 0xffffbe00 | 4;
    }
    else {
      dVar4 = sqlite3VdbeRealValue(pMem);
      pMem->r = dVar4;
      uVar1 = pMem->flags;
      pMem->flags = uVar1 & 0xbe00 | 8;
      sqlite3VdbeIntegerAffinity(pMem);
      uVar3 = (uint)pMem->flags;
    }
  }
  pMem->flags = (u16)(uVar3 & 0xffed);
  return uVar3 & 0xffed;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemNumerify(Mem *pMem){
  if( (pMem->flags & (MEM_Int|MEM_Real|MEM_Null))==0 ){
    assert( (pMem->flags & (MEM_Blob|MEM_Str))!=0 );
    assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
    if( 0==sqlite3Atoi64(pMem->z, &pMem->u.i, pMem->n, pMem->enc) ){
      MemSetTypeFlag(pMem, MEM_Int);
    }else{
      pMem->r = sqlite3VdbeRealValue(pMem);
      MemSetTypeFlag(pMem, MEM_Real);
      sqlite3VdbeIntegerAffinity(pMem);
    }
  }
  assert( (pMem->flags & (MEM_Int|MEM_Real|MEM_Null))!=0 );
  pMem->flags &= ~(MEM_Str|MEM_Blob);
  return SQLITE_OK;
}